

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddLCache.c
# Opt level: O1

DdNode * cuddLocalCacheLookup(DdLocalCache *cache,DdNodePtr *key)

{
  unsigned_long *puVar1;
  uint uVar2;
  uint uVar3;
  DdLocalCacheItem *__ptr;
  uint uVar4;
  _func_void_long *p_Var5;
  int iVar6;
  ulong uVar7;
  DdLocalCacheItem *__s;
  long lVar8;
  ulong uVar9;
  int iVar10;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  undefined8 *puVar14;
  ulong uVar15;
  DdNode *n;
  double dVar16;
  
  dVar16 = cache->lookUps + 1.0;
  cache->lookUps = dVar16;
  uVar2 = cache->keysize;
  uVar12 = (ulong)uVar2;
  iVar10 = cache->shift;
  uVar13 = *(int *)key * 0x40f1f9;
  if (1 < uVar12) {
    uVar7 = 1;
    do {
      uVar13 = uVar13 * 0xc00005 + *(int *)(key + uVar7);
      uVar7 = uVar7 + 1;
    } while (uVar12 != uVar7);
  }
  __ptr = cache->item;
  uVar3 = cache->itemsize;
  uVar15 = (ulong)((uVar13 >> ((byte)iVar10 & 0x1f)) * uVar3);
  uVar7 = *(ulong *)((long)__ptr->key + (uVar15 - 8));
  if (uVar7 != 0) {
    puVar14 = (undefined8 *)((long)__ptr->key + (uVar15 - 8));
    iVar6 = bcmp(key,puVar14 + 1,uVar12 * 8);
    if (iVar6 == 0) {
      cache->hits = cache->hits + 1.0;
      n = (DdNode *)(uVar7 & 0xfffffffffffffffe);
      if (n->ref == 0) {
        cuddReclaim(cache->manager,n);
      }
      return (DdNode *)*puVar14;
    }
  }
  uVar13 = cache->slots;
  if ((uVar13 < cache->maxslots) && (dVar16 * cache->minHit < cache->hits)) {
    uVar4 = uVar13 * 2;
    cache->slots = uVar4;
    p_Var5 = Extra_UtilMMoutOfMemory;
    Extra_UtilMMoutOfMemory = Cudd_OutOfMem;
    __s = (DdLocalCacheItem *)malloc((ulong)(uVar4 * uVar3));
    cache->item = __s;
    Extra_UtilMMoutOfMemory = p_Var5;
    if (__s == (DdLocalCacheItem *)0x0) {
      cache->slots = uVar13;
      cache->item = __ptr;
      cache->maxslots = uVar13 - 1;
    }
    else {
      iVar10 = iVar10 + -1;
      cache->shift = iVar10;
      puVar1 = &cache->manager->memused;
      *puVar1 = *puVar1 + (ulong)(uVar13 * uVar3);
      uVar7 = 0;
      memset(__s,0,(ulong)(uVar4 * uVar3));
      if (uVar13 != 0) {
        uVar15 = 0;
        do {
          uVar9 = (ulong)(uVar3 * (int)uVar15);
          if (*(long *)((long)__ptr->key + (uVar9 - 8)) != 0) {
            puVar14 = (undefined8 *)((long)__ptr->key + (uVar9 - 8));
            uVar11 = *(int *)(puVar14 + 1) * 0x40f1f9;
            if (1 < uVar2) {
              lVar8 = 0;
              do {
                uVar11 = uVar11 * 0xc00005 + *(int *)((long)__ptr[1].key + lVar8 * 8 + uVar7 + -8);
                lVar8 = lVar8 + 1;
              } while (uVar12 - 1 != lVar8);
            }
            uVar9 = (ulong)((uVar11 >> ((byte)iVar10 & 0x1f)) * uVar3);
            memcpy((void *)((long)__s->key + uVar9),puVar14 + 1,uVar12 * 8);
            *(undefined8 *)((long)__s->key + (uVar9 - 8)) = *puVar14;
          }
          uVar15 = uVar15 + 1;
          uVar7 = (ulong)((int)uVar7 + uVar3);
        } while (uVar15 != uVar13);
      }
      if (__ptr != (DdLocalCacheItem *)0x0) {
        free(__ptr);
      }
      cache->lookUps = (double)(int)((double)uVar4 * cache->minHit + 1.0);
      cache->hits = 0.0;
    }
  }
  return (DdNode *)0x0;
}

Assistant:

DdNode *
cuddLocalCacheLookup(
  DdLocalCache * cache,
  DdNodePtr * key)
{
    unsigned int posn;
    DdLocalCacheItem *entry;
    DdNode *value;

    cache->lookUps++;
    posn = ddLCHash(key,cache->keysize,cache->shift);
    entry = (DdLocalCacheItem *) ((char *) cache->item +
                                  posn * cache->itemsize);
    if (entry->value != NULL &&
        memcmp(key,entry->key,cache->keysize*sizeof(DdNode *)) == 0) {
        cache->hits++;
        value = Cudd_Regular(entry->value);
        if (value->ref == 0) {
            cuddReclaim(cache->manager,value);
        }
        return(entry->value);
    }

    /* Cache miss: decide whether to resize */

    if (cache->slots < cache->maxslots &&
        cache->hits > cache->lookUps * cache->minHit) {
        cuddLocalCacheResize(cache);
    }

    return(NULL);

}